

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O3

void __thiscall cursespp::AppLayout::AppLayout(AppLayout *this,App *app)

{
  _Rb_tree_header *p_Var1;
  
  LayoutBase::LayoutBase(&this->super_LayoutBase,(IWindow *)0x0);
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a3f28;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->super_has_slots<sigslot::multi_threaded_local>).
                      super_multi_threaded_local.m_mutex,(pthread_mutexattr_t *)0x0);
  p_Var1 = &(this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->super_has_slots<sigslot::multi_threaded_local>).m_senders._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__AppLayout_001a3a00;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__AppLayout_001a3c80;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__AppLayout_001a3cb0;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__AppLayout_001a3cd8;
  (this->super_LayoutBase).super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__AppLayout_001a3d00;
  (this->super_LayoutBase).super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__AppLayout_001a3da8;
  (this->super_LayoutBase).super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__AppLayout_001a3dd0;
  (this->super_LayoutBase).super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__AppLayout_001a3df8;
  (this->super_LayoutBase).super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__AppLayout_001a3e28;
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__AppLayout_001a3e58;
  (this->shortcuts).super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->shortcuts).super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->hotkey).super___shared_ptr<cursespp::TextLabel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->hotkey).super___shared_ptr<cursespp::TextLabel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->topLevelLayout = (ITopLevelLayout *)0x0;
  this->paddingT = 0;
  this->paddingL = 0;
  this->paddingB = 0;
  *(undefined8 *)((long)&this->paddingB + 1) = 0;
  *(undefined8 *)((long)&this->paddingR + 1) = 0;
  Initialize(this);
  return;
}

Assistant:

AppLayout::AppLayout(cursespp::App& app)
: topLevelLayout(nullptr)
, LayoutBase() {
    this->Initialize();
    this->EnableDemoModeIfNecessary();
}